

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

string * __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry::AsString_abi_cxx11_
          (string *__return_storage_ptr__,SymbolEntry *this,DescriptorIndex *index)

{
  pointer pEVar1;
  undefined8 uVar2;
  size_t size;
  pointer pcVar3;
  size_t size_00;
  AlphaNum *in_R8;
  AlphaNum local_b0;
  undefined8 local_80;
  size_t local_78;
  AlphaNum local_50;
  
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = pEVar1[this->data_offset].encoded_package._M_dataplus;
  size = pEVar1[this->data_offset].encoded_package._M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  local_b0.piece_size_ = (size_t)(size != 0);
  local_b0.piece_data_ = "";
  if (size != 0) {
    local_b0.piece_data_ = ".";
  }
  pcVar3 = (this->encoded_symbol)._M_dataplus._M_p;
  size_00 = (this->encoded_symbol)._M_string_length;
  local_80 = uVar2;
  local_78 = size;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  local_50.piece_data_ = pcVar3;
  local_50.piece_size_ = size_00;
  StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_80,&local_b0,&local_50,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string AsString(const DescriptorIndex& index) const {
      auto p = package(index);
      return StrCat(p, p.empty() ? "" : ".", symbol(index));
    }